

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<long_double,_3>::TPZManVector
          (TPZManVector<long_double,_3> *this,TPZManVector<long_double,_3> *rval)

{
  int64_t iVar1;
  TPZVec<long_double> *in_RSI;
  TPZVec<long_double> *in_RDI;
  int i;
  int64_t size;
  int local_28;
  
  TPZVec<long_double>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_023d9cc8;
  iVar1 = TPZVec<long_double>::NElements(in_RSI);
  if (iVar1 < 4) {
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      *(unkbyte10 *)(&in_RDI[1]._vptr_TPZVec + (long)local_28 * 2) =
           *(unkbyte10 *)(&in_RSI[1]._vptr_TPZVec + (long)local_28 * 2);
    }
    for (; local_28 < 3; local_28 = local_28 + 1) {
      *(longdouble *)(&in_RDI[1]._vptr_TPZVec + (long)local_28 * 2) = (longdouble)0;
    }
    in_RDI->fStore = (longdouble *)(in_RDI + 1);
    in_RDI->fNElements = iVar1;
    in_RDI->fNAlloc = 0;
  }
  else {
    in_RDI->fStore = in_RSI->fStore;
    in_RDI->fNElements = iVar1;
    in_RDI->fNAlloc = iVar1;
  }
  in_RSI->fStore = (longdouble *)0x0;
  in_RSI->fNAlloc = 0;
  in_RSI->fNElements = 0;
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(TPZManVector< T, NumExtAlloc >&& rval) {

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (auto size = rval.NElements();size <= NumExtAlloc){
        //we need to copy, unfortunately
        int i = 0;
        for(; i < size; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else {// The size requested is bigger than the size already provided.
        this->fStore = rval.fStore;
        this->fNElements = size;
        this->fNAlloc = size;
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
}